

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FillReadRequests(SstStream Stream,FFSArrayRequest_conflict Reqs)

{
  size_t *psVar1;
  int iVar2;
  size_t *PartialCounts;
  FFSArrayRequest *in_RSI;
  size_t in_RDI;
  int unaff_retaddr;
  size_t *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int j;
  size_t BlockElemCount;
  int i;
  size_t DataOffset;
  size_t LocalBlockID;
  int FreeIncoming;
  void *IncomingData;
  int Type;
  size_t *SelSize;
  size_t *SelOffsetFree;
  size_t *SelOffset;
  size_t *RankSize;
  size_t *RankOffsetFree;
  size_t *RankOffset;
  size_t *GlobalDimensionsFree;
  size_t *GlobalDimensions;
  int DimCount;
  size_t ElementSize;
  int WriterRank;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  SstStream in_stack_ffffffffffffff60;
  int local_94;
  void *local_60;
  size_t *local_50;
  void *local_48;
  void *local_38;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int i_00;
  
  for (; in_RSI != (FFSArrayRequest *)0x0; in_RSI = in_RSI->Next) {
    ImplementGapWarning(in_stack_ffffffffffffff60,
                        (FFSArrayRequest_conflict)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x238); i_00 = i_00 + 1) {
      iVar2 = NeedWriter(in_RSI,i_00);
      if (iVar2 != 0) {
        PartialCounts = (size_t *)(long)in_RSI->VarRec->ElementSize;
        iVar2 = (int)in_RSI->VarRec->DimCount;
        local_38 = (void *)0x0;
        local_48 = (void *)0x0;
        local_50 = in_RSI->VarRec->PerWriterCounts[i_00];
        psVar1 = in_RSI->Start;
        local_60 = (void *)0x0;
        if (in_RSI->RequestType == Local) {
          for (local_94 = 0;
              (ulong)(long)local_94 < in_RSI->BlockID - in_RSI->VarRec->PerWriterBlockStart[i_00];
              local_94 = local_94 + 1) {
            in_stack_ffffffffffffff60 = (SstStream)0x1;
            for (in_stack_ffffffffffffff5c = 0; in_stack_ffffffffffffff5c < iVar2;
                in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
              in_stack_ffffffffffffff60 =
                   (SstStream)
                   (local_50[in_stack_ffffffffffffff5c] * (long)in_stack_ffffffffffffff60);
            }
            local_50 = local_50 + iVar2;
          }
          local_48 = calloc((long)iVar2,8);
          local_38 = calloc((long)iVar2,8);
          if (psVar1 == (size_t *)0x0) {
            local_60 = calloc((long)iVar2,8);
          }
          for (local_94 = 0; local_94 < iVar2; local_94 = local_94 + 1) {
            *(size_t *)((long)local_38 + (long)i_00 * 8) = local_50[i_00];
          }
        }
        if (*(int *)(*(long *)(in_RDI + 0x120) + 0x48) == 0) {
          ExtractSelectionFromPartialCM
                    (unaff_retaddr,in_RDI,(size_t *)in_RSI,
                     (size_t *)CONCAT44(i_00,in_stack_ffffffffffffffe8),PartialCounts,
                     (size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_stack_00000010,
                     in_stack_00000018,in_stack_00000020);
        }
        else {
          ExtractSelectionFromPartialRM
                    (unaff_retaddr,in_RDI,(size_t *)in_RSI,
                     (size_t *)CONCAT44(i_00,in_stack_ffffffffffffffe8),PartialCounts,
                     (size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_stack_00000010,
                     in_stack_00000018,in_stack_00000020);
        }
        free(local_60);
        free(local_38);
        free(local_48);
      }
    }
  }
  return;
}

Assistant:

static void FillReadRequests(SstStream Stream, FFSArrayRequest Reqs)
{
    while (Reqs)
    {
        ImplementGapWarning(Stream, Reqs);
        for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
        {
            if (NeedWriter(Reqs, WriterRank))
            {
                /* if needed this writer fill destination with acquired data */
                size_t ElementSize = Reqs->VarRec->ElementSize;
                int DimCount = (int)Reqs->VarRec->DimCount;
                size_t *GlobalDimensions = Reqs->VarRec->GlobalDims;
                size_t *GlobalDimensionsFree = NULL;
                size_t *RankOffset = Reqs->VarRec->PerWriterStart[WriterRank];
                size_t *RankOffsetFree = NULL;
                size_t *RankSize = Reqs->VarRec->PerWriterCounts[WriterRank];
                size_t *SelOffset = Reqs->Start;
                size_t *SelOffsetFree = NULL;
                size_t *SelSize = Reqs->Count;
                int Type = Reqs->VarRec->Type;
                void *IncomingData = Reqs->VarRec->PerWriterIncomingData[WriterRank];
                int FreeIncoming = 0;

                if (Reqs->RequestType == Local)
                {
                    size_t LocalBlockID =
                        Reqs->BlockID - Reqs->VarRec->PerWriterBlockStart[WriterRank];
                    size_t DataOffset = 0;
                    int i;
                    for (i = 0; i < LocalBlockID; i++)
                    {
                        size_t BlockElemCount = 1;
                        for (int j = 0; j < DimCount; j++)
                        {
                            BlockElemCount *= RankSize[j];
                        }
                        DataOffset += BlockElemCount * ElementSize;
                        RankSize += DimCount;
                    }
                    RankOffset = calloc(DimCount, sizeof(RankOffset[0]));
                    RankOffsetFree = RankOffset;
                    GlobalDimensions = calloc(DimCount, sizeof(GlobalDimensions[0]));
                    GlobalDimensionsFree = GlobalDimensions;
                    if (SelOffset == NULL)
                    {
                        SelOffset = calloc(DimCount, sizeof(RankOffset[0]));
                        SelOffsetFree = SelOffset;
                    }
                    for (i = 0; i < DimCount; i++)
                    {
                        GlobalDimensions[WriterRank] = RankSize[WriterRank];
                    }
                    IncomingData = (char *)IncomingData + DataOffset;
                }
                if ((Stream->WriterConfigParams->CompressionMethod == SstCompressZFP) &&
                    ZFPcompressionPossible(Type, DimCount))
                {
#ifdef ADIOS2_HAVE_ZFP
                    /*
                     * replace old IncomingData with uncompressed, and free
                     * afterwards
                     */
                    size_t IncomingSize = Reqs->VarRec->PerWriterIncomingSize[WriterRank];
                    FreeIncoming = 1;
                    IncomingData = FFS_ZFPDecompress(Stream, DimCount, Type, IncomingData,
                                                     IncomingSize, RankSize, NULL);
#endif
                }
                if (Stream->ConfigParams->IsRowMajor)
                {
                    ExtractSelectionFromPartialRM((int)ElementSize, DimCount, GlobalDimensions,
                                                  RankOffset, RankSize, SelOffset, SelSize,
                                                  IncomingData, Reqs->Data);
                }
                else
                {
                    ExtractSelectionFromPartialCM((int)ElementSize, DimCount, GlobalDimensions,
                                                  RankOffset, RankSize, SelOffset, SelSize,
                                                  IncomingData, Reqs->Data);
                }
                free(SelOffsetFree);
                free(GlobalDimensionsFree);
                free(RankOffsetFree);
                if (FreeIncoming)
                {
                    /* free uncompressed  */
                    free(IncomingData);
                }
            }
        }
        Reqs = Reqs->Next;
    }
}